

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O1

Time __thiscall Storage::Tape::Tape::get_current_time(Tape *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long uVar2;
  Time TVar3;
  uint extraout_EDX;
  Time TVar4;
  uint uVar5;
  _Ct __n2;
  ulong __n;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  _Ct __m2;
  ulong uVar9;
  ulong uVar10;
  
  iVar1 = (*this->_vptr_Tape[1])();
  lVar7 = CONCAT44(extraout_var,iVar1);
  this->offset_ = 0;
  (*this->_vptr_Tape[8])(this);
  if (lVar7 == 0) {
    TVar3.length = 0;
    TVar3.clock_rate = 1;
  }
  else {
    TVar4.length = 0;
    TVar4.clock_rate = 0;
    __n = 1;
    do {
      iVar1 = (*this->_vptr_Tape[7])(this);
      (this->pulse_).type = iVar1;
      (this->pulse_).length.length = extraout_var_00;
      (this->pulse_).length.clock_rate = extraout_EDX;
      this->offset_ = this->offset_ + 1;
      uVar9 = (ulong)(this->pulse_).length.length;
      uVar6 = __n;
      if (uVar9 != 0) {
        if (TVar4.length == 0) {
          TVar4 = (this->pulse_).length;
          uVar6 = (ulong)TVar4 >> 0x20;
        }
        else {
          uVar5 = (this->pulse_).length.clock_rate;
          if ((uint)__n == uVar5) {
            uVar9 = uVar9 + ((ulong)TVar4 & 0xffffffff);
          }
          else {
            uVar9 = uVar9 * __n + ((ulong)TVar4 & 0xffffffff) * (ulong)uVar5;
            __n = __n * uVar5;
          }
          if ((__n | uVar9) >> 0x20 == 0) {
LAB_00458f5c:
            uVar6 = __n & 0xffffffff;
            TVar4 = (Time)(uVar9 & 0xffffffff);
          }
          else {
            uVar6 = 1;
            if (uVar9 == 0) {
              TVar4.length = 0;
              TVar4.clock_rate = 0;
            }
            else {
              uVar10 = uVar9;
              if (((__n | uVar9) & 0xf) == 0) {
                do {
                  uVar9 = uVar10 >> 4;
                  uVar5 = (uint)__n;
                  uVar8 = (uint)uVar10;
                  __n = __n >> 4;
                  uVar10 = uVar9;
                } while (((uVar8 | uVar5) & 0xf0) == 0);
              }
              uVar5 = ((uint)uVar9 | (uint)__n) & 1;
              while (uVar5 == 0) {
                uVar5 = (uint)__n;
                __n = __n >> 1;
                uVar5 = ((uint)uVar9 | uVar5) & 2;
                uVar9 = uVar9 >> 1;
              }
              if ((uVar9 >> 0x20 != 0) || (__n >> 0x20 != 0)) {
                uVar2 = std::__detail::__gcd<unsigned_long>(uVar9,__n);
                uVar9 = uVar9 / uVar2;
                __n = __n / uVar2;
                do {
                  if (uVar9 >> 0x20 == 0) {
                    if (__n >> 0x20 == 0) break;
                  }
                  else if (__n < 2) break;
                  uVar9 = uVar9 >> 1;
                  __n = __n >> 1;
                } while( true );
              }
              TVar4.length = 0xffffffff;
              TVar4.clock_rate = 0;
              if ((uVar9 >> 0x20 == 0) && (__n >> 0x20 == 0)) goto LAB_00458f5c;
            }
          }
        }
      }
      lVar7 = lVar7 + -1;
      __n = uVar6;
    } while (lVar7 != 0);
    TVar3 = (Time)((ulong)TVar4 & 0xffffffff | uVar6 << 0x20);
  }
  return TVar3;
}

Assistant:

Storage::Time Tape::get_current_time() {
	Time time(0);
	uint64_t steps = get_offset();
	reset();
	while(steps--) {
		get_next_pulse();
		time += pulse_.length;
	}
	return time;
}